

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * libtorrent::extension(string *__return_storage_ptr__,string *f)

{
  char *pcVar1;
  allocator<char> local_29;
  long local_28;
  size_t idx;
  string *psStack_18;
  int i;
  string *f_local;
  
  psStack_18 = f;
  f_local = __return_storage_ptr__;
  idx._4_4_ = ::std::__cxx11::string::size();
  while (idx._4_4_ = idx._4_4_ + -1, -1 < idx._4_4_) {
    local_28 = (long)idx._4_4_;
    pcVar1 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
    if (*pcVar1 == '/') break;
    pcVar1 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
    if (*pcVar1 == '.') {
      ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psStack_18);
      return __return_storage_ptr__;
    }
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",&local_29);
  ::std::allocator<char>::~allocator(&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string extension(std::string const& f)
	{
		for (int i = int(f.size()) - 1; i >= 0; --i)
		{
			auto const idx = static_cast<std::size_t>(i);
			if (f[idx] == '/') break;
#ifdef TORRENT_WINDOWS
			if (f[idx] == '\\') break;
#endif
			if (f[idx] != '.') continue;
			return f.substr(idx);
		}
		return "";
	}